

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O0

char * deqp::gls::RandomArrayGenerator::createQuads<deqp::gls::GLValue::WrappedFloatType<double>>
                 (int seed,int count,int componentCount,int offset,int stride,Primitive primitive,
                 WrappedFloatType<double> min,WrappedFloatType<double> max,float gridSize)

{
  bool bVar1;
  char *pcVar2;
  float fVar3;
  float fVar4;
  WrappedFloatType<double> WVar5;
  int local_1fc;
  int i_1;
  int local_1ec;
  int i;
  WrappedFloatType<double> local_178;
  double local_170;
  double local_168;
  double local_160;
  WrappedFloatType<double> local_158;
  double local_150;
  double local_148;
  double local_140;
  Double local_138;
  WrappedFloatType<double> local_130;
  double local_128;
  double local_120;
  double local_118;
  WrappedFloatType<double> local_110;
  double local_108;
  double local_100;
  double local_f8;
  Double local_f0;
  WrappedFloatType<double> local_e8;
  double local_e0;
  double local_d8;
  double local_d0;
  WrappedFloatType<double> local_c8;
  double local_c0;
  int local_b4;
  WrappedFloatType<double> WStack_b0;
  int attemptNdx;
  WrappedFloatType<double> w;
  WrappedFloatType<double> z;
  WrappedFloatType<double> y2;
  WrappedFloatType<double> y1;
  WrappedFloatType<double> x2;
  WrappedFloatType<double> x1;
  Double DStack_78;
  int quadNdx;
  WrappedFloatType<double> local_70;
  WrappedFloatType<double> minDiff;
  WrappedFloatType<double> minQuadSize;
  deRandom rnd;
  char *_data;
  char *resultData;
  int quadStride;
  int componentStride;
  float gridSize_local;
  Primitive primitive_local;
  int stride_local;
  int offset_local;
  int componentCount_local;
  int count_local;
  int seed_local;
  WrappedFloatType<double> max_local;
  WrappedFloatType<double> min_local;
  
  resultData._4_4_ = 0;
  gridSize_local = (float)stride;
  if (stride == 0) {
    gridSize_local = (float)(componentCount * 8);
  }
  if (primitive == PRIMITIVE_TRIANGLES) {
    resultData._4_4_ = (int)gridSize_local * 6;
  }
  _count_local = max.m_value;
  max_local = min;
  pcVar2 = (char *)operator_new__((long)(offset + resultData._4_4_ * count));
  deRandom_init((deRandom *)&minQuadSize,seed);
  if (primitive == PRIMITIVE_TRIANGLES) {
    fVar3 = gls::GLValue::WrappedFloatType<double>::to<float>
                      ((WrappedFloatType<double> *)&count_local);
    fVar4 = gls::GLValue::WrappedFloatType<double>::to<float>(&max_local);
    fVar3 = deFloatAbs(fVar3 - fVar4);
    minDiff = gls::GLValue::WrappedFloatType<double>::fromFloat(fVar3 * gridSize);
    DStack_78 = minValue<deqp::gls::GLValue::WrappedFloatType<double>>();
    bVar1 = gls::GLValue::WrappedFloatType<double>::operator>(&stack0xffffffffffffff88,&minDiff);
    if (bVar1) {
      local_70.m_value = (double)minValue<deqp::gls::GLValue::WrappedFloatType<double>>();
    }
    else {
      local_70.m_value = minDiff.m_value;
    }
    for (x1.m_value._4_4_ = 0; x1.m_value._4_4_ < count; x1.m_value._4_4_ = x1.m_value._4_4_ + 1) {
      for (local_b4 = 0; local_b4 < 4; local_b4 = local_b4 + 1) {
        local_d0 = max_local.m_value;
        local_d8 = _count_local;
        local_c8.m_value =
             (double)getRandom<deqp::gls::GLValue::WrappedFloatType<double>>
                               ((deRandom *)&minQuadSize,max_local.m_value,_count_local);
        local_c0 = (double)roundTo<deqp::gls::GLValue::WrappedFloatType<double>>
                                     (&local_70,&local_c8);
        local_f0.m_value = local_70.m_value;
        x2.m_value = local_c0;
        local_100 = (double)gls::GLValue::WrappedFloatType<double>::operator-
                                      ((WrappedFloatType<double> *)&count_local,&x2);
        local_f8 = (double)abs<deqp::gls::GLValue::WrappedFloatType<double>>((Double)local_100);
        local_e8.m_value =
             (double)getRandom<deqp::gls::GLValue::WrappedFloatType<double>>
                               ((deRandom *)&minQuadSize,local_f0,(Double)local_f8);
        local_e0 = (double)roundTo<deqp::gls::GLValue::WrappedFloatType<double>>
                                     (&local_70,&local_e8);
        local_118 = max_local.m_value;
        local_120 = _count_local;
        y1.m_value = local_e0;
        local_110.m_value =
             (double)getRandom<deqp::gls::GLValue::WrappedFloatType<double>>
                               ((deRandom *)&minQuadSize,max_local.m_value,_count_local);
        local_108 = (double)roundTo<deqp::gls::GLValue::WrappedFloatType<double>>
                                      (&local_70,&local_110);
        local_138.m_value = local_70.m_value;
        y2.m_value = local_108;
        local_148 = (double)gls::GLValue::WrappedFloatType<double>::operator-
                                      ((WrappedFloatType<double> *)&count_local,&y2);
        local_140 = (double)abs<deqp::gls::GLValue::WrappedFloatType<double>>((Double)local_148);
        local_130.m_value =
             (double)getRandom<deqp::gls::GLValue::WrappedFloatType<double>>
                               ((deRandom *)&minQuadSize,local_138,(Double)local_140);
        local_128 = (double)roundTo<deqp::gls::GLValue::WrappedFloatType<double>>
                                      (&local_70,&local_130);
        z = (WrappedFloatType<double>)local_128;
        if (componentCount < 3) {
          local_150 = (double)gls::GLValue::WrappedFloatType<double>::create(0.0);
        }
        else {
          local_160 = max_local.m_value;
          local_168 = _count_local;
          local_158.m_value =
               (double)getRandom<deqp::gls::GLValue::WrappedFloatType<double>>
                                 ((deRandom *)&minQuadSize,max_local.m_value,_count_local);
          local_150 = (double)roundTo<deqp::gls::GLValue::WrappedFloatType<double>>
                                        (&local_70,&local_158);
        }
        w.m_value = local_150;
        if (componentCount < 4) {
          local_170 = (double)gls::GLValue::WrappedFloatType<double>::create(1.0);
        }
        else {
          local_178.m_value =
               (double)getRandom<deqp::gls::GLValue::WrappedFloatType<double>>
                                 ((deRandom *)&minQuadSize,max_local.m_value,_count_local);
          local_170 = (double)roundTo<deqp::gls::GLValue::WrappedFloatType<double>>
                                        (&local_70,&local_178);
        }
        WStack_b0.m_value = local_170;
        if (componentCount < 3) break;
        fVar3 = gls::GLValue::WrappedFloatType<double>::to<float>(&y1);
        fVar4 = gls::GLValue::WrappedFloatType<double>::to<float>(&w);
        fVar3 = deFloatAbs(fVar3 + fVar4);
        fVar4 = gls::GLValue::WrappedFloatType<double>::to<float>(&local_70);
        if (fVar4 <= fVar3) {
          fVar3 = gls::GLValue::WrappedFloatType<double>::to<float>(&z);
          fVar4 = gls::GLValue::WrappedFloatType<double>::to<float>(&stack0xffffffffffffff50);
          fVar3 = deFloatAbs(fVar3 + fVar4);
          fVar4 = gls::GLValue::WrappedFloatType<double>::to<float>(&local_70);
          if (fVar4 <= fVar3) break;
        }
      }
      alignmentSafeAssignment<deqp::gls::GLValue::WrappedFloatType<double>>
                (pcVar2 + (long)(x1.m_value._4_4_ * resultData._4_4_) + (long)offset,x2);
      alignmentSafeAssignment<deqp::gls::GLValue::WrappedFloatType<double>>
                (pcVar2 + (long)(x1.m_value._4_4_ * resultData._4_4_ + 8) + (long)offset,y2);
      WVar5 = gls::GLValue::WrappedFloatType<double>::operator+(&x2,&y1);
      alignmentSafeAssignment<deqp::gls::GLValue::WrappedFloatType<double>>
                (pcVar2 + (long)(x1.m_value._4_4_ * resultData._4_4_ + (int)gridSize_local) +
                          (long)offset,WVar5);
      alignmentSafeAssignment<deqp::gls::GLValue::WrappedFloatType<double>>
                (pcVar2 + (long)(x1.m_value._4_4_ * resultData._4_4_ + (int)gridSize_local + 8) +
                          (long)offset,y2);
      alignmentSafeAssignment<deqp::gls::GLValue::WrappedFloatType<double>>
                (pcVar2 + (long)(x1.m_value._4_4_ * resultData._4_4_ + (int)gridSize_local * 2) +
                          (long)offset,x2);
      WVar5 = gls::GLValue::WrappedFloatType<double>::operator+(&y2,&z);
      alignmentSafeAssignment<deqp::gls::GLValue::WrappedFloatType<double>>
                (pcVar2 + (long)(x1.m_value._4_4_ * resultData._4_4_ + (int)gridSize_local * 2 + 8)
                          + (long)offset,WVar5);
      alignmentSafeAssignment<deqp::gls::GLValue::WrappedFloatType<double>>
                (pcVar2 + (long)(x1.m_value._4_4_ * resultData._4_4_ + (int)gridSize_local * 3) +
                          (long)offset,x2);
      WVar5 = gls::GLValue::WrappedFloatType<double>::operator+(&y2,&z);
      alignmentSafeAssignment<deqp::gls::GLValue::WrappedFloatType<double>>
                (pcVar2 + (long)(x1.m_value._4_4_ * resultData._4_4_ + (int)gridSize_local * 3 + 8)
                          + (long)offset,WVar5);
      WVar5 = gls::GLValue::WrappedFloatType<double>::operator+(&x2,&y1);
      alignmentSafeAssignment<deqp::gls::GLValue::WrappedFloatType<double>>
                (pcVar2 + (long)(x1.m_value._4_4_ * resultData._4_4_ + (int)gridSize_local * 4) +
                          (long)offset,WVar5);
      alignmentSafeAssignment<deqp::gls::GLValue::WrappedFloatType<double>>
                (pcVar2 + (long)(x1.m_value._4_4_ * resultData._4_4_ + (int)gridSize_local * 4 + 8)
                          + (long)offset,y2);
      WVar5 = gls::GLValue::WrappedFloatType<double>::operator+(&x2,&y1);
      alignmentSafeAssignment<deqp::gls::GLValue::WrappedFloatType<double>>
                (pcVar2 + (long)(x1.m_value._4_4_ * resultData._4_4_ + (int)gridSize_local * 5) +
                          (long)offset,WVar5);
      WVar5 = gls::GLValue::WrappedFloatType<double>::operator+(&y2,&z);
      alignmentSafeAssignment<deqp::gls::GLValue::WrappedFloatType<double>>
                (pcVar2 + (long)(x1.m_value._4_4_ * resultData._4_4_ + (int)gridSize_local * 5 + 8)
                          + (long)offset,WVar5);
      if (2 < componentCount) {
        for (local_1ec = 0; local_1ec < 6; local_1ec = local_1ec + 1) {
          alignmentSafeAssignment<deqp::gls::GLValue::WrappedFloatType<double>>
                    (pcVar2 + (long)(x1.m_value._4_4_ * resultData._4_4_ +
                                     (int)gridSize_local * local_1ec + 0x10) + (long)offset,w);
        }
      }
      if (3 < componentCount) {
        for (local_1fc = 0; local_1fc < 6; local_1fc = local_1fc + 1) {
          alignmentSafeAssignment<deqp::gls::GLValue::WrappedFloatType<double>>
                    (pcVar2 + (long)(x1.m_value._4_4_ * resultData._4_4_ +
                                     (int)gridSize_local * local_1fc + 0x18) + (long)offset,
                     WStack_b0);
        }
      }
    }
  }
  return pcVar2;
}

Assistant:

char* RandomArrayGenerator::createQuads (int seed, int count, int componentCount, int offset, int stride, Array::Primitive primitive, T min, T max, float gridSize)
{
	int componentStride = sizeof(T);
	int quadStride = 0;

	if (stride == 0)
		stride = componentCount * componentStride;

	DE_ASSERT(stride >= componentCount * componentStride);

	switch (primitive)
	{
		case Array::PRIMITIVE_TRIANGLES:
			quadStride = stride * 6;
			break;

		default:
			DE_ASSERT(false);
			break;
	}

	char* resultData = new char[offset + quadStride * count];
	char* _data = resultData;
	resultData = resultData + offset;

	deRandom rnd;
	deRandom_init(&rnd,  seed);

	switch (primitive)
	{
		case Array::PRIMITIVE_TRIANGLES:
		{
			const T	minQuadSize	= T::fromFloat(deFloatAbs(max.template to<float>() - min.template to<float>()) * gridSize);
			const T	minDiff		= minValue<T>() > minQuadSize
								? minValue<T>()
								: minQuadSize;

			for (int quadNdx = 0; quadNdx < count; ++quadNdx)
			{
				T x1, x2;
				T y1, y2;
				T z, w;

				// attempt to find a good (i.e not extremely small) quad
				for (int attemptNdx = 0; attemptNdx < 4; ++attemptNdx)
				{
					x1 = roundTo(minDiff, getRandom<T>(rnd, min, max));
					x2 = roundTo(minDiff, getRandom<T>(rnd, minDiff, abs<T>(max - x1)));

					y1 = roundTo(minDiff, getRandom<T>(rnd, min, max));
					y2 = roundTo(minDiff, getRandom<T>(rnd, minDiff, abs<T>(max - y1)));

					z = (componentCount > 2) ? roundTo(minDiff, (getRandom<T>(rnd, min, max))) : (T::create(0));
					w = (componentCount > 3) ? roundTo(minDiff, (getRandom<T>(rnd, min, max))) : (T::create(1));

					// no additional components, all is good
					if (componentCount <= 2)
						break;

					// The result quad is too thin?
					if ((deFloatAbs(x2.template to<float>() + z.template to<float>()) < minDiff.template to<float>()) ||
						(deFloatAbs(y2.template to<float>() + w.template to<float>()) < minDiff.template to<float>()))
						continue;

					// all ok
					break;
				}

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride]), x1);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + componentStride]), y1);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride]), x1 + x2);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride + componentStride]), y1);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 2]), x1);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 2 + componentStride]), y1 + y2);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 3]), x1);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 3 + componentStride]), y1 + y2);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 4]), x1 + x2);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 4 + componentStride]), y1);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 5]), x1 + x2);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 5 + componentStride]), y1 + y2);

				if (componentCount > 2)
				{
					for (int i = 0; i < 6; i++)
						alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * i + componentStride * 2]), z);
				}

				if (componentCount > 3)
				{
					for (int i = 0; i < 6; i++)
						alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * i + componentStride * 3]), w);
				}
			}

			break;
		}

		default:
			DE_ASSERT(false);
			break;
	}

	return _data;
}